

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

void __thiscall spvtools::opt::ConstantFoldingRules::AddFoldingRules(ConstantFoldingRules *this)

{
  unordered_map<spv::Op,_spvtools::opt::ConstantFoldingRules::Value,_spvtools::opt::ConstantFoldingRules::hasher,_std::equal_to<spv::Op>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>_>
  *this_00;
  uint32_t uVar1;
  ConstantFoldingRules *pCVar2;
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  *pvVar3;
  FeatureManager *pFVar4;
  map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
  *this_01;
  key_type local_dec;
  undefined8 local_de8;
  undefined8 uStack_de0;
  code *local_dd8;
  code *local_dd0;
  ConstantFoldingRules *local_dc0;
  BinaryScalarFoldingRule local_db8;
  BinaryScalarFoldingRule local_d98;
  UnaryScalarFoldingRule local_d78;
  UnaryScalarFoldingRule local_d58;
  UnaryScalarFoldingRule local_d38;
  UnaryScalarFoldingRule local_d18;
  UnaryScalarFoldingRule local_cf8;
  UnaryScalarFoldingRule local_cd8;
  UnaryScalarFoldingRule local_cb8;
  UnaryScalarFoldingRule local_c98;
  UnaryScalarFoldingRule local_c78;
  UnaryScalarFoldingRule local_c58;
  UnaryScalarFoldingRule local_c38;
  BinaryScalarFoldingRule local_c18;
  BinaryScalarFoldingRule local_bf8;
  BinaryScalarFoldingRule local_bd8;
  BinaryScalarFoldingRule local_bb8;
  BinaryScalarFoldingRule local_b98;
  BinaryScalarFoldingRule local_b78;
  BinaryScalarFoldingRule local_b58;
  BinaryScalarFoldingRule local_b38;
  BinaryScalarFoldingRule local_b18;
  BinaryScalarFoldingRule local_af8;
  BinaryScalarFoldingRule local_ad8;
  BinaryScalarFoldingRule local_ab8;
  BinaryScalarFoldingRule local_a98;
  BinaryScalarFoldingRule local_a78;
  _Any_data local_a58;
  _Manager_type local_a48;
  _Any_data local_a38;
  _Manager_type local_a28;
  _Any_data local_a18;
  _Manager_type local_a08;
  _Any_data local_9f8;
  _Manager_type local_9e8;
  _Any_data local_9d8;
  _Manager_type local_9c8;
  _Any_data local_9b8;
  _Manager_type local_9a8;
  _Any_data local_998;
  _Manager_type local_988;
  _Any_data local_978;
  _Manager_type local_968;
  _Any_data local_958;
  _Manager_type local_948;
  _Any_data local_938;
  _Manager_type local_928;
  _Any_data local_918;
  _Manager_type local_908;
  _Any_data local_8f8;
  _Manager_type local_8e8;
  _Any_data local_8d8;
  _Manager_type local_8c8;
  _Any_data local_8b8;
  _Manager_type local_8a8;
  _Any_data local_898;
  _Manager_type local_888;
  _Any_data local_878;
  _Manager_type local_868;
  _Any_data local_858;
  _Manager_type local_848;
  _Any_data local_838;
  _Manager_type local_828;
  _Any_data local_818;
  _Manager_type local_808;
  UnaryScalarFoldingRule local_7f8;
  UnaryScalarFoldingRule local_7d8;
  _Any_data local_7b8;
  code *local_7a8;
  code *local_7a0;
  _Any_data local_798;
  code *local_788;
  code *local_780;
  _Any_data local_778;
  code *local_768;
  code *local_760;
  _Any_data local_758;
  code *local_748;
  code *local_740;
  _Any_data local_738;
  code *local_728;
  code *local_720;
  _Any_data local_718;
  code *local_708;
  code *local_700;
  _Any_data local_6f8;
  code *local_6e8;
  code *local_6e0;
  _Any_data local_6d8;
  code *local_6c8;
  code *local_6c0;
  _Any_data local_6b8;
  code *local_6a8;
  code *local_6a0;
  _Any_data local_698;
  code *local_688;
  code *local_680;
  _Any_data local_678;
  code *local_668;
  code *local_660;
  _Any_data local_658;
  code *local_648;
  code *local_640;
  _Any_data local_638;
  code *local_628;
  code *local_620;
  _Any_data local_618;
  code *local_608;
  code *local_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *local_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *local_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  _Any_data local_590;
  _Manager_type local_580;
  _Any_data local_570;
  _Manager_type local_560;
  _Any_data local_550;
  _Manager_type local_540;
  _Any_data local_530;
  _Manager_type local_520;
  _Any_data local_510;
  _Manager_type local_500;
  _Any_data local_4f0;
  _Manager_type local_4e0;
  _Any_data local_4d0;
  _Manager_type local_4c0;
  _Any_data local_4b0;
  _Manager_type local_4a0;
  _Any_data local_490;
  _Manager_type local_480;
  _Any_data local_470;
  _Manager_type local_460;
  _Any_data local_450;
  _Manager_type local_440;
  _Any_data local_430;
  _Manager_type local_420;
  _Any_data local_410;
  _Manager_type local_400;
  value_type local_3f0;
  value_type local_3d0;
  value_type local_3b0;
  value_type local_390;
  value_type local_370;
  value_type local_350;
  value_type local_330;
  value_type local_310;
  value_type local_2f0;
  _Any_data local_2d0;
  _Manager_type local_2c0;
  _Any_data local_2b0;
  _Manager_type local_2a0;
  _Any_data local_290;
  _Manager_type local_280;
  _Any_data local_270;
  _Manager_type local_260;
  _Any_data local_250;
  _Manager_type local_240;
  _Any_data local_230;
  _Manager_type local_220;
  _Any_data local_210;
  _Manager_type local_200;
  _Any_data local_1f0;
  _Manager_type local_1e0;
  _Any_data local_1d0;
  _Manager_type local_1c0;
  _Any_data local_1b0;
  _Manager_type local_1a0;
  _Any_data local_190;
  _Manager_type local_180;
  _Any_data local_170;
  _Manager_type local_160;
  _Any_data local_150;
  _Manager_type local_140;
  _Any_data local_130;
  _Manager_type local_120;
  value_type local_110;
  _Any_data local_f0;
  _Manager_type local_e0;
  _Any_data local_d0;
  _Manager_type local_c0;
  _Any_data local_b0;
  _Manager_type local_a0;
  _Any_data local_90;
  _Manager_type local_80;
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  
  this_00 = &this->rules_;
  local_de8._0_4_ = 0x50;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_5b8._M_unused._M_object = (void *)0x0;
  local_5b8._8_8_ = 0;
  local_5a0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:621:10)>
              ::_M_invoke;
  local_5a8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:621:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_5b8);
  if (local_5a8 != (code *)0x0) {
    (*local_5a8)(&local_5b8,&local_5b8,__destroy_functor);
  }
  local_de8._0_4_ = 0x51;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_5d8._M_unused._M_object = (void *)0x0;
  local_5d8._8_8_ = 0;
  local_5c0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:109:10)>
              ::_M_invoke;
  local_5c8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:109:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_5d8);
  if (local_5c8 != (code *)0x0) {
    (*local_5c8)(&local_5d8,&local_5d8,__destroy_functor);
  }
  local_de8._0_4_ = 0x52;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_5f8._M_unused._M_object = (void *)0x0;
  local_5f8._8_8_ = 0;
  local_5e0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:140:10)>
              ::_M_invoke;
  local_5e8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:140:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_5f8);
  if (local_5e8 != (code *)0x0) {
    (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
  }
  local_de8._0_4_ = 0x6e;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  anon_unknown_0::FoldFToI();
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  local_de8._0_4_ = 0x6d;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  anon_unknown_0::FoldFToI();
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  local_de8._0_4_ = 0x6f;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  anon_unknown_0::FoldIToF();
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_90);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  local_de8._0_4_ = 0x70;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  anon_unknown_0::FoldIToF();
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  local_de8._0_4_ = 0x72;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_7d8.super__Function_base._M_functor._8_8_ = 0;
  local_7d8.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldScalarSConvert
  ;
  local_7d8._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
       ::_M_invoke;
  local_7d8.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
       ::_M_manager;
  anon_unknown_0::FoldUnaryOp((ConstantFoldingRule *)&local_d0,&local_7d8);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_d0);
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if (local_7d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7d8.super__Function_base._M_manager)
              ((_Any_data *)&local_7d8,(_Any_data *)&local_7d8,__destroy_functor);
  }
  local_de8._0_4_ = 0x71;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_7f8.super__Function_base._M_functor._8_8_ = 0;
  local_7f8.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldScalarUConvert
  ;
  local_7f8._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
       ::_M_invoke;
  local_7f8.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
       ::_M_manager;
  anon_unknown_0::FoldUnaryOp((ConstantFoldingRule *)&local_f0,&local_7f8);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_f0);
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  if (local_7f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_7f8.super__Function_base._M_manager)
              ((_Any_data *)&local_7f8,(_Any_data *)&local_7f8,__destroy_functor);
  }
  local_de8._0_4_ = 0x94;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_618._M_unused._M_object = (void *)0x0;
  local_618._8_8_ = 0;
  local_600 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1130:10)>
              ::_M_invoke;
  local_608 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1130:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_618);
  if (local_608 != (code *)0x0) {
    (*local_608)(&local_618,&local_618,__destroy_functor);
  }
  local_dec = OpFAdd;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:986:56)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:986:56)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_818,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_818);
  if (local_808 != (code *)0x0) {
    (*local_808)(&local_818,&local_818,__destroy_functor);
  }
  local_dec = OpFDiv;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  uStack_de0 = 0;
  local_de8 = anon_unknown_0::FoldScalarFPDivide;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_838,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_838);
  if (local_828 != (code *)0x0) {
    (*local_828)(&local_838,&local_838,__destroy_functor);
  }
  local_dec = OpFMul;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:987:56)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:987:56)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_858,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_858);
  if (local_848 != (code *)0x0) {
    (*local_848)(&local_858,&local_858,__destroy_functor);
  }
  local_dec = OpFSub;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:985:56)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:985:56)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_878,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_878);
  if (local_868 != (code *)0x0) {
    (*local_868)(&local_878,&local_878,__destroy_functor);
  }
  local_dec = OpFOrdEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1091:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1091:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_898,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_898);
  if (local_888 != (code *)0x0) {
    (*local_888)(&local_898,&local_898,__destroy_functor);
  }
  local_dec = OpFUnordEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1094:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1094:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_8b8,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_8b8);
  if (local_8a8 != (code *)0x0) {
    (*local_8a8)(&local_8b8,&local_8b8,__destroy_functor);
  }
  local_dec = OpFOrdNotEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1097:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1097:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_8d8,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_8d8);
  if (local_8c8 != (code *)0x0) {
    (*local_8c8)(&local_8d8,&local_8d8,__destroy_functor);
  }
  local_dec = OpFUnordNotEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1100:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1100:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_8f8,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_8f8);
  if (local_8e8 != (code *)0x0) {
    (*local_8e8)(&local_8f8,&local_8f8,__destroy_functor);
  }
  local_dec = OpFOrdLessThan;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1103:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1103:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_918,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  local_dc0 = this;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_918);
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,__destroy_functor);
  }
  local_de8._0_4_ = 0xb8;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_638._8_8_ = 0;
  local_638._M_unused._M_member_pointer = 0xb8;
  local_620 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_628 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_638);
  if (local_628 != (code *)0x0) {
    (*local_628)(&local_638,&local_638,__destroy_functor);
  }
  local_dec = OpFUnordLessThan;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1106:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1106:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_938,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_938);
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,__destroy_functor);
  }
  local_de8._0_4_ = 0xb9;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_658._8_8_ = 0;
  local_658._M_unused._M_member_pointer = 0xb9;
  local_640 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_648 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_658);
  if (local_648 != (code *)0x0) {
    (*local_648)(&local_658,&local_658,__destroy_functor);
  }
  local_dec = OpFOrdGreaterThan;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1109:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1109:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_958,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_958);
  if (local_948 != (code *)0x0) {
    (*local_948)(&local_958,&local_958,__destroy_functor);
  }
  local_de8._0_4_ = 0xba;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_678._8_8_ = 0;
  local_678._M_unused._M_member_pointer = 0xba;
  local_660 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_668 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_678);
  if (local_668 != (code *)0x0) {
    (*local_668)(&local_678,&local_678,__destroy_functor);
  }
  local_dec = OpFUnordGreaterThan;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1112:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1112:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_978,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_978);
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,__destroy_functor);
  }
  local_de8._0_4_ = 0xbb;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_698._8_8_ = 0;
  local_698._M_unused._M_member_pointer = 0xbb;
  local_680 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_688 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_698);
  if (local_688 != (code *)0x0) {
    (*local_688)(&local_698,&local_698,__destroy_functor);
  }
  local_dec = OpFOrdLessThanEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1115:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1115:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_998,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_998);
  if (local_988 != (code *)0x0) {
    (*local_988)(&local_998,&local_998,__destroy_functor);
  }
  local_de8._0_4_ = 0xbc;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_6b8._8_8_ = 0;
  local_6b8._M_unused._M_member_pointer = 0xbc;
  local_6a0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_6a8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_6b8);
  if (local_6a8 != (code *)0x0) {
    (*local_6a8)(&local_6b8,&local_6b8,__destroy_functor);
  }
  local_dec = OpFUnordLessThanEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1118:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1118:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_9b8,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_9b8);
  if (local_9a8 != (code *)0x0) {
    (*local_9a8)(&local_9b8,&local_9b8,__destroy_functor);
  }
  local_de8._0_4_ = 0xbd;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_6d8._8_8_ = 0;
  local_6d8._M_unused._M_member_pointer = 0xbd;
  local_6c0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_6c8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_6d8);
  if (local_6c8 != (code *)0x0) {
    (*local_6c8)(&local_6d8,&local_6d8,__destroy_functor);
  }
  local_dec = OpFOrdGreaterThanEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1121:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1121:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_9d8,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_9d8);
  if (local_9c8 != (code *)0x0) {
    (*local_9c8)(&local_9d8,&local_9d8,__destroy_functor);
  }
  local_de8._0_4_ = 0xbe;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_6f8._8_8_ = 0;
  local_6f8._M_unused._M_member_pointer = 0xbe;
  local_6e0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_6e8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_6f8);
  if (local_6e8 != (code *)0x0) {
    (*local_6e8)(&local_6f8,&local_6f8,__destroy_functor);
  }
  local_dec = OpFUnordGreaterThanEqual;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1124:25)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1124:25)>
              ::_M_manager;
  anon_unknown_0::FoldFPBinaryOp
            ((ConstantFoldingRule *)&local_9f8,(BinaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_9f8);
  if (local_9e8 != (code *)0x0) {
    (*local_9e8)(&local_9f8,&local_9f8,__destroy_functor);
  }
  local_de8._0_4_ = 0xbf;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_718._8_8_ = 0;
  local_718._M_unused._M_member_pointer = 0xbf;
  local_700 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_invoke;
  local_708 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1206:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_718);
  if (local_708 != (code *)0x0) {
    (*local_708)(&local_718,&local_718,__destroy_functor);
  }
  local_de8._0_4_ = 0x4f;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_738._M_unused._M_object = (void *)0x0;
  local_738._8_8_ = 0;
  local_720 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:230:10)>
              ::_M_invoke;
  local_728 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:230:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_738);
  if (local_728 != (code *)0x0) {
    (*local_728)(&local_738,&local_738,__destroy_functor);
  }
  local_de8._0_4_ = 0x8e;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_758._M_unused._M_object = (void *)0x0;
  local_758._8_8_ = 0;
  local_740 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:286:10)>
              ::_M_invoke;
  local_748 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:286:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_758);
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  local_de8._0_4_ = 0x90;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_778._M_unused._M_object = (void *)0x0;
  local_778._8_8_ = 0;
  local_760 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:424:10)>
              ::_M_invoke;
  local_768 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:424:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_778);
  if (local_768 != (code *)0x0) {
    (*local_768)(&local_778,&local_778,__destroy_functor);
  }
  local_de8._0_4_ = 0x91;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_798._M_unused._M_object = (void *)0x0;
  local_798._8_8_ = 0;
  local_780 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:521:10)>
              ::_M_invoke;
  local_788 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:521:10)>
              ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_798);
  if (local_788 != (code *)0x0) {
    (*local_788)(&local_798,&local_798,__destroy_functor);
  }
  local_de8._0_4_ = 0x54;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_110.super__Function_base._M_functor._8_8_ = 0;
  local_110.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldTranspose;
  local_110._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_invoke;
  local_110.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
       ::_M_manager;
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,&local_110);
  if (local_110.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_110.super__Function_base._M_manager)
              ((_Any_data *)&local_110,(_Any_data *)&local_110,__destroy_functor);
  }
  local_dec = OpFNegate;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  uStack_de0 = 0;
  local_de8 = anon_unknown_0::NegateFPConst;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              ::_M_manager;
  anon_unknown_0::FoldFPUnaryOp
            ((ConstantFoldingRule *)&local_a18,(UnaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_a18);
  if (local_a08 != (code *)0x0) {
    (*local_a08)(&local_a18,&local_a18,__destroy_functor);
  }
  local_dec = OpSNegate;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  uStack_de0 = 0;
  local_de8 = anon_unknown_0::NegateIntConst;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
              ::_M_manager;
  anon_unknown_0::FoldUnaryOp
            ((ConstantFoldingRule *)&local_a38,(UnaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_a38);
  if (local_a28 != (code *)0x0) {
    (*local_a28)(&local_a38,&local_a38,__destroy_functor);
  }
  local_dec = OpQuantizeToF16;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,&local_dec)->value;
  local_de8 = (code *)0x0;
  uStack_de0 = 0;
  local_dd0 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:925:10)>
              ::_M_invoke;
  local_dd8 = std::
              _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:925:10)>
              ::_M_manager;
  anon_unknown_0::FoldFPUnaryOp
            ((ConstantFoldingRule *)&local_a58,(UnaryScalarFoldingRule *)&local_de8);
  if (local_dd8 != (_Manager_type)0x0) {
    (*local_dd8)((_Any_data *)&local_de8,(_Any_data *)&local_de8,__destroy_functor);
  }
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_a58);
  if (local_a48 != (code *)0x0) {
    (*local_a48)(&local_a58,&local_a58,__destroy_functor);
  }
  local_de8._0_4_ = 0x80;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_a78.super__Function_base._M_functor._8_8_ = 0;
  local_a78.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_a78._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_a78.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_130,&local_a78);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_130);
  if (local_120 != (code *)0x0) {
    (*local_120)(&local_130,&local_130,__destroy_functor);
  }
  if (local_a78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a78.super__Function_base._M_manager)
              ((_Any_data *)&local_a78,(_Any_data *)&local_a78,__destroy_functor);
  }
  local_de8._0_4_ = 0x82;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_a98.super__Function_base._M_functor._8_8_ = 0;
  local_a98.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_a98._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_a98.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_150,&local_a98);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_150);
  if (local_140 != (code *)0x0) {
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  if (local_a98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a98.super__Function_base._M_manager)
              ((_Any_data *)&local_a98,(_Any_data *)&local_a98,__destroy_functor);
  }
  local_de8._0_4_ = 0x84;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_ab8.super__Function_base._M_functor._8_8_ = 0;
  local_ab8.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_ab8._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_ab8.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_170,&local_ab8);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_170);
  if (local_160 != (code *)0x0) {
    (*local_160)(&local_170,&local_170,__destroy_functor);
  }
  if (local_ab8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ab8.super__Function_base._M_manager)
              ((_Any_data *)&local_ab8,(_Any_data *)&local_ab8,__destroy_functor);
  }
  local_de8._0_4_ = 0x86;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_ad8.super__Function_base._M_functor._8_8_ = 0;
  local_ad8.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_ad8._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_ad8.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_190,&local_ad8);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_190);
  if (local_180 != (code *)0x0) {
    (*local_180)(&local_190,&local_190,__destroy_functor);
  }
  if (local_ad8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_ad8.super__Function_base._M_manager)
              ((_Any_data *)&local_ad8,(_Any_data *)&local_ad8,__destroy_functor);
  }
  local_de8._0_4_ = 0x87;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_af8.super__Function_base._M_functor._8_8_ = 0;
  local_af8.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_af8._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_af8.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_1b0,&local_af8);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_1b0);
  if (local_1a0 != (code *)0x0) {
    (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
  }
  if (local_af8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_af8.super__Function_base._M_manager)
              ((_Any_data *)&local_af8,(_Any_data *)&local_af8,__destroy_functor);
  }
  local_de8._0_4_ = 0x89;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_b18.super__Function_base._M_functor._8_8_ = 0;
  local_b18.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_b18._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_b18.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_1d0,&local_b18);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_1d0);
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(&local_1d0,&local_1d0,__destroy_functor);
  }
  if (local_b18.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b18.super__Function_base._M_manager)
              ((_Any_data *)&local_b18,(_Any_data *)&local_b18,__destroy_functor);
  }
  local_de8._0_4_ = 0x8a;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_b38.super__Function_base._M_functor._8_8_ = 0;
  local_b38.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_b38._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_b38.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_1f0,&local_b38);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_1f0);
  if (local_1e0 != (code *)0x0) {
    (*local_1e0)(&local_1f0,&local_1f0,__destroy_functor);
  }
  if (local_b38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b38.super__Function_base._M_manager)
              ((_Any_data *)&local_b38,(_Any_data *)&local_b38,__destroy_functor);
  }
  local_de8._0_4_ = 0x8b;
  pvVar3 = &std::__detail::
            _Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<spv::Op,_std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>,_std::allocator<std::pair<const_spv::Op,_spvtools::opt::ConstantFoldingRules::Value>_>,_std::__detail::_Select1st,_std::equal_to<spv::Op>,_spvtools::opt::ConstantFoldingRules::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_de8)->value;
  local_b58.super__Function_base._M_functor._8_8_ = 0;
  local_b58.super__Function_base._M_functor._M_unused._M_object =
       AddFoldingRules::anon_class_1_0_00000001::__invoke;
  local_b58._M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_invoke;
  local_b58.super__Function_base._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1659:7)>
       ::_M_manager;
  anon_unknown_0::FoldBinaryOp((ConstantFoldingRule *)&local_210,&local_b58);
  std::
  vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
  ::push_back(pvVar3,(value_type *)&local_210);
  if (local_200 != (code *)0x0) {
    (*local_200)(&local_210,&local_210,__destroy_functor);
  }
  pCVar2 = local_dc0;
  if (local_b58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b58.super__Function_base._M_manager)
              ((_Any_data *)&local_b58,(_Any_data *)&local_b58,__destroy_functor);
  }
  pFVar4 = IRContext::get_feature_mgr(pCVar2->context_);
  uVar1 = pFVar4->extinst_importid_GLSLstd450_;
  if (uVar1 != 0) {
    this_01 = &pCVar2->ext_rules_;
    local_de8._4_4_ = 0x2e;
    local_de8._0_4_ = uVar1;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_7b8._M_unused._M_object = (void *)0x0;
    local_7b8._8_8_ = 0;
    local_7a0 = std::
                _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1361:10)>
                ::_M_invoke;
    local_7a8 = std::
                _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1361:10)>
                ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_7b8);
    if (local_7a8 != (code *)0x0) {
      (*local_7a8)(&local_7b8,&local_7b8,__destroy_functor);
    }
    local_de8._4_4_ = 0x27;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_b78.super__Function_base._M_functor._8_8_ = 0;
    local_b78.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldMin;
    local_b78._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_b78.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_230,&local_b78);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_230);
    if (local_220 != (code *)0x0) {
      (*local_220)(&local_230,&local_230,__destroy_functor);
    }
    if (local_b78.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_b78.super__Function_base._M_manager)
                ((_Any_data *)&local_b78,(_Any_data *)&local_b78,__destroy_functor);
    }
    local_de8._4_4_ = 0x26;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_b98.super__Function_base._M_functor._8_8_ = 0;
    local_b98.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldMin;
    local_b98._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_b98.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_250,&local_b98);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_250);
    if (local_240 != (code *)0x0) {
      (*local_240)(&local_250,&local_250,__destroy_functor);
    }
    if (local_b98.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_b98.super__Function_base._M_manager)
                ((_Any_data *)&local_b98,(_Any_data *)&local_b98,__destroy_functor);
    }
    local_de8._4_4_ = 0x25;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_bb8.super__Function_base._M_functor._8_8_ = 0;
    local_bb8.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldMin;
    local_bb8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_bb8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_270,&local_bb8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_270);
    if (local_260 != (code *)0x0) {
      (*local_260)(&local_270,&local_270,__destroy_functor);
    }
    if (local_bb8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_bb8.super__Function_base._M_manager)
                ((_Any_data *)&local_bb8,(_Any_data *)&local_bb8,__destroy_functor);
    }
    local_de8._4_4_ = 0x2a;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_bd8.super__Function_base._M_functor._8_8_ = 0;
    local_bd8.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldMax;
    local_bd8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_bd8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_290,&local_bd8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_290);
    if (local_280 != (code *)0x0) {
      (*local_280)(&local_290,&local_290,__destroy_functor);
    }
    if (local_bd8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_bd8.super__Function_base._M_manager)
                ((_Any_data *)&local_bd8,(_Any_data *)&local_bd8,__destroy_functor);
    }
    local_de8._4_4_ = 0x29;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_bf8.super__Function_base._M_functor._8_8_ = 0;
    local_bf8.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldMax;
    local_bf8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_bf8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_2b0,&local_bf8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_2b0);
    if (local_2a0 != (code *)0x0) {
      (*local_2a0)(&local_2b0,&local_2b0,__destroy_functor);
    }
    if (local_bf8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_bf8.super__Function_base._M_manager)
                ((_Any_data *)&local_bf8,(_Any_data *)&local_bf8,__destroy_functor);
    }
    local_de8._4_4_ = 0x28;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_c18.super__Function_base._M_functor._8_8_ = 0;
    local_c18.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldMax;
    local_c18._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_invoke;
    local_c18.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_const_spvtools::opt::analysis::Constant_*(*)(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_2d0,&local_c18);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_2d0);
    if (local_2c0 != (code *)0x0) {
      (*local_2c0)(&local_2d0,&local_2d0,__destroy_functor);
    }
    if (local_c18.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_c18.super__Function_base._M_manager)
                ((_Any_data *)&local_c18,(_Any_data *)&local_c18,__destroy_functor);
    }
    local_de8._4_4_ = 0x2c;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_2f0.super__Function_base._M_functor._8_8_ = 0;
    local_2f0.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp1;
    local_2f0._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_2f0.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_2f0);
    if (local_2f0.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_2f0.super__Function_base._M_manager)
                ((_Any_data *)&local_2f0,(_Any_data *)&local_2f0,__destroy_functor);
    }
    local_de8._4_4_ = 0x2c;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_310.super__Function_base._M_functor._8_8_ = 0;
    local_310.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp2;
    local_310._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_310.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_310);
    if (local_310.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_310.super__Function_base._M_manager)
                ((_Any_data *)&local_310,(_Any_data *)&local_310,__destroy_functor);
    }
    local_de8._4_4_ = 0x2c;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_330.super__Function_base._M_functor._8_8_ = 0;
    local_330.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp3;
    local_330._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_330.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_330);
    if (local_330.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_330.super__Function_base._M_manager)
                ((_Any_data *)&local_330,(_Any_data *)&local_330,__destroy_functor);
    }
    local_de8._4_4_ = 0x2d;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_350.super__Function_base._M_functor._8_8_ = 0;
    local_350.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp1;
    local_350._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_350.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_350);
    if (local_350.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_350.super__Function_base._M_manager)
                ((_Any_data *)&local_350,(_Any_data *)&local_350,__destroy_functor);
    }
    local_de8._4_4_ = 0x2d;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_370.super__Function_base._M_functor._8_8_ = 0;
    local_370.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp2;
    local_370._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_370.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_370);
    if (local_370.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_370.super__Function_base._M_manager)
                ((_Any_data *)&local_370,(_Any_data *)&local_370,__destroy_functor);
    }
    local_de8._4_4_ = 0x2d;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_390.super__Function_base._M_functor._8_8_ = 0;
    local_390.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp3;
    local_390._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_390.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_390);
    if (local_390.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_390.super__Function_base._M_manager)
                ((_Any_data *)&local_390,(_Any_data *)&local_390,__destroy_functor);
    }
    local_de8._4_4_ = 0x2b;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_3b0.super__Function_base._M_functor._8_8_ = 0;
    local_3b0.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp1;
    local_3b0._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_3b0.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_3b0);
    if (local_3b0.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3b0.super__Function_base._M_manager)
                ((_Any_data *)&local_3b0,(_Any_data *)&local_3b0,__destroy_functor);
    }
    local_de8._4_4_ = 0x2b;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_3d0.super__Function_base._M_functor._8_8_ = 0;
    local_3d0.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp2;
    local_3d0._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_3d0.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_3d0);
    if (local_3d0.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3d0.super__Function_base._M_manager)
                ((_Any_data *)&local_3d0,(_Any_data *)&local_3d0,__destroy_functor);
    }
    local_de8._4_4_ = 0x2b;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_3f0.super__Function_base._M_functor._8_8_ = 0;
    local_3f0.super__Function_base._M_functor._M_unused._M_object = anon_unknown_0::FoldClamp3;
    local_3f0._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_invoke;
    local_3f0.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_const_spvtools::opt::analysis::Constant_*(*)(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>
         ::_M_manager;
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,&local_3f0);
    if (local_3f0.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_3f0.super__Function_base._M_manager)
                ((_Any_data *)&local_3f0,(_Any_data *)&local_3f0,__destroy_functor);
    }
    local_de8._4_4_ = 0xd;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_c38.super__Function_base._M_functor._8_8_ = 0;
    local_c38.super__Function_base._M_functor._M_unused._M_function_pointer = sin;
    local_c38._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_c38.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_410,&local_c38);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_410);
    if (local_400 != (code *)0x0) {
      (*local_400)(&local_410,&local_410,__destroy_functor);
    }
    if (local_c38.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_c38.super__Function_base._M_manager)
                ((_Any_data *)&local_c38,(_Any_data *)&local_c38,__destroy_functor);
    }
    local_de8._4_4_ = 0xe;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_c58.super__Function_base._M_functor._8_8_ = 0;
    local_c58.super__Function_base._M_functor._M_unused._M_function_pointer = cos;
    local_c58._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_c58.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_430,&local_c58);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_430);
    if (local_420 != (code *)0x0) {
      (*local_420)(&local_430,&local_430,__destroy_functor);
    }
    if (local_c58.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_c58.super__Function_base._M_manager)
                ((_Any_data *)&local_c58,(_Any_data *)&local_c58,__destroy_functor);
    }
    local_de8._4_4_ = 0xf;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_c78.super__Function_base._M_functor._8_8_ = 0;
    local_c78.super__Function_base._M_functor._M_unused._M_function_pointer = tan;
    local_c78._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_c78.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_450,&local_c78);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_450);
    if (local_440 != (code *)0x0) {
      (*local_440)(&local_450,&local_450,__destroy_functor);
    }
    if (local_c78.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_c78.super__Function_base._M_manager)
                ((_Any_data *)&local_c78,(_Any_data *)&local_c78,__destroy_functor);
    }
    local_de8._4_4_ = 0x10;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_c98.super__Function_base._M_functor._8_8_ = 0;
    local_c98.super__Function_base._M_functor._M_unused._M_function_pointer = asin;
    local_c98._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_c98.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_470,&local_c98);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_470);
    if (local_460 != (code *)0x0) {
      (*local_460)(&local_470,&local_470,__destroy_functor);
    }
    if (local_c98.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_c98.super__Function_base._M_manager)
                ((_Any_data *)&local_c98,(_Any_data *)&local_c98,__destroy_functor);
    }
    local_de8._4_4_ = 0x11;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_cb8.super__Function_base._M_functor._8_8_ = 0;
    local_cb8.super__Function_base._M_functor._M_unused._M_function_pointer = acos;
    local_cb8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_cb8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_490,&local_cb8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_490);
    if (local_480 != (code *)0x0) {
      (*local_480)(&local_490,&local_490,__destroy_functor);
    }
    if (local_cb8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_cb8.super__Function_base._M_manager)
                ((_Any_data *)&local_cb8,(_Any_data *)&local_cb8,__destroy_functor);
    }
    local_de8._4_4_ = 0x12;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_cd8.super__Function_base._M_functor._8_8_ = 0;
    local_cd8.super__Function_base._M_functor._M_unused._M_function_pointer = atan;
    local_cd8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_cd8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_4b0,&local_cd8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_4b0);
    if (local_4a0 != (code *)0x0) {
      (*local_4a0)(&local_4b0,&local_4b0,__destroy_functor);
    }
    if (local_cd8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_cd8.super__Function_base._M_manager)
                ((_Any_data *)&local_cd8,(_Any_data *)&local_cd8,__destroy_functor);
    }
    local_de8._4_4_ = 0x1b;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_cf8.super__Function_base._M_functor._8_8_ = 0;
    local_cf8.super__Function_base._M_functor._M_unused._M_function_pointer = exp;
    local_cf8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_cf8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_4d0,&local_cf8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_4d0);
    if (local_4c0 != (code *)0x0) {
      (*local_4c0)(&local_4d0,&local_4d0,__destroy_functor);
    }
    if (local_cf8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_cf8.super__Function_base._M_manager)
                ((_Any_data *)&local_cf8,(_Any_data *)&local_cf8,__destroy_functor);
    }
    local_de8._4_4_ = 0x1c;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_d18.super__Function_base._M_functor._8_8_ = 0;
    local_d18.super__Function_base._M_functor._M_unused._M_function_pointer = log;
    local_d18._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_d18.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_4f0,&local_d18);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_4f0);
    if (local_4e0 != (code *)0x0) {
      (*local_4e0)(&local_4f0,&local_4f0,__destroy_functor);
    }
    if (local_d18.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d18.super__Function_base._M_manager)
                ((_Any_data *)&local_d18,(_Any_data *)&local_d18,__destroy_functor);
    }
    local_de8._4_4_ = 0x1d;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_d38.super__Function_base._M_functor._8_8_ = 0;
    local_d38.super__Function_base._M_functor._M_unused._M_function_pointer = exp2;
    local_d38._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_d38.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_510,&local_d38);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_510);
    if (local_500 != (code *)0x0) {
      (*local_500)(&local_510,&local_510,__destroy_functor);
    }
    if (local_d38.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d38.super__Function_base._M_manager)
                ((_Any_data *)&local_d38,(_Any_data *)&local_d38,__destroy_functor);
    }
    local_de8._4_4_ = 0x1e;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_d58.super__Function_base._M_functor._8_8_ = 0;
    local_d58.super__Function_base._M_functor._M_unused._M_function_pointer = log2;
    local_d58._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_d58.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_530,&local_d58);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_530);
    if (local_520 != (code *)0x0) {
      (*local_520)(&local_530,&local_530,__destroy_functor);
    }
    if (local_d58.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d58.super__Function_base._M_manager)
                ((_Any_data *)&local_d58,(_Any_data *)&local_d58,__destroy_functor);
    }
    local_de8._4_4_ = 0x1f;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_d78.super__Function_base._M_functor._8_8_ = 0;
    local_d78.super__Function_base._M_functor._M_unused._M_function_pointer = sqrt;
    local_d78._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_invoke;
    local_d78.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1595:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPUnaryOp((ConstantFoldingRule *)&local_550,&local_d78);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_550);
    if (local_540 != (code *)0x0) {
      (*local_540)(&local_550,&local_550,__destroy_functor);
    }
    if (local_d78.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d78.super__Function_base._M_manager)
                ((_Any_data *)&local_d78,(_Any_data *)&local_d78,__destroy_functor);
    }
    local_de8._4_4_ = 0x19;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_d98.super__Function_base._M_functor._8_8_ = 0;
    local_d98.super__Function_base._M_functor._M_unused._M_function_pointer = atan2;
    local_d98._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1621:7)>
         ::_M_invoke;
    local_d98.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1621:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_570,&local_d98);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_570);
    if (local_560 != (code *)0x0) {
      (*local_560)(&local_570,&local_570,__destroy_functor);
    }
    if (local_d98.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d98.super__Function_base._M_manager)
                ((_Any_data *)&local_d98,(_Any_data *)&local_d98,__destroy_functor);
    }
    local_de8._4_4_ = 0x1a;
    pvVar3 = &std::
              map<spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value,_std::less<spvtools::opt::ConstantFoldingRules::Key>,_std::allocator<std::pair<const_spvtools::opt::ConstantFoldingRules::Key,_spvtools::opt::ConstantFoldingRules::Value>_>_>
              ::operator[](this_01,(key_type *)&local_de8)->value;
    local_db8.super__Function_base._M_functor._8_8_ = 0;
    local_db8.super__Function_base._M_functor._M_unused._M_function_pointer = pow;
    local_db8._M_invoker =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1621:7)>
         ::_M_invoke;
    local_db8.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::opt::analysis::Constant_*(const_spvtools::opt::analysis::Type_*,_const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_spvtools::opt::analysis::ConstantManager_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/const_folding_rules.cpp:1621:7)>
         ::_M_manager;
    anon_unknown_0::FoldFPBinaryOp((ConstantFoldingRule *)&local_590,&local_db8);
    std::
    vector<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
    ::push_back(pvVar3,(value_type *)&local_590);
    if (local_580 != (code *)0x0) {
      (*local_580)(&local_590,&local_590,__destroy_functor);
    }
    if (local_db8.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_db8.super__Function_base._M_manager)
                ((_Any_data *)&local_db8,(_Any_data *)&local_db8,__destroy_functor);
    }
  }
  return;
}

Assistant:

void ConstantFoldingRules::AddFoldingRules() {
  // Add all folding rules to the list for the opcodes to which they apply.
  // Note that the order in which rules are added to the list matters. If a rule
  // applies to the instruction, the rest of the rules will not be attempted.
  // Take that into consideration.

  rules_[spv::Op::OpCompositeConstruct].push_back(FoldCompositeWithConstants());

  rules_[spv::Op::OpCompositeExtract].push_back(FoldExtractWithConstants());
  rules_[spv::Op::OpCompositeInsert].push_back(FoldInsertWithConstants());

  rules_[spv::Op::OpConvertFToS].push_back(FoldFToI());
  rules_[spv::Op::OpConvertFToU].push_back(FoldFToI());
  rules_[spv::Op::OpConvertSToF].push_back(FoldIToF());
  rules_[spv::Op::OpConvertUToF].push_back(FoldIToF());
  rules_[spv::Op::OpSConvert].push_back(FoldUnaryOp(FoldScalarSConvert));
  rules_[spv::Op::OpUConvert].push_back(FoldUnaryOp(FoldScalarUConvert));

  rules_[spv::Op::OpDot].push_back(FoldOpDotWithConstants());
  rules_[spv::Op::OpFAdd].push_back(FoldFAdd());
  rules_[spv::Op::OpFDiv].push_back(FoldFDiv());
  rules_[spv::Op::OpFMul].push_back(FoldFMul());
  rules_[spv::Op::OpFSub].push_back(FoldFSub());

  rules_[spv::Op::OpFOrdEqual].push_back(FoldFOrdEqual());

  rules_[spv::Op::OpFUnordEqual].push_back(FoldFUnordEqual());

  rules_[spv::Op::OpFOrdNotEqual].push_back(FoldFOrdNotEqual());

  rules_[spv::Op::OpFUnordNotEqual].push_back(FoldFUnordNotEqual());

  rules_[spv::Op::OpFOrdLessThan].push_back(FoldFOrdLessThan());
  rules_[spv::Op::OpFOrdLessThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdLessThan));

  rules_[spv::Op::OpFUnordLessThan].push_back(FoldFUnordLessThan());
  rules_[spv::Op::OpFUnordLessThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordLessThan));

  rules_[spv::Op::OpFOrdGreaterThan].push_back(FoldFOrdGreaterThan());
  rules_[spv::Op::OpFOrdGreaterThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdGreaterThan));

  rules_[spv::Op::OpFUnordGreaterThan].push_back(FoldFUnordGreaterThan());
  rules_[spv::Op::OpFUnordGreaterThan].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordGreaterThan));

  rules_[spv::Op::OpFOrdLessThanEqual].push_back(FoldFOrdLessThanEqual());
  rules_[spv::Op::OpFOrdLessThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdLessThanEqual));

  rules_[spv::Op::OpFUnordLessThanEqual].push_back(FoldFUnordLessThanEqual());
  rules_[spv::Op::OpFUnordLessThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordLessThanEqual));

  rules_[spv::Op::OpFOrdGreaterThanEqual].push_back(FoldFOrdGreaterThanEqual());
  rules_[spv::Op::OpFOrdGreaterThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFOrdGreaterThanEqual));

  rules_[spv::Op::OpFUnordGreaterThanEqual].push_back(
      FoldFUnordGreaterThanEqual());
  rules_[spv::Op::OpFUnordGreaterThanEqual].push_back(
      FoldFClampFeedingCompare(spv::Op::OpFUnordGreaterThanEqual));

  rules_[spv::Op::OpVectorShuffle].push_back(FoldVectorShuffleWithConstants());
  rules_[spv::Op::OpVectorTimesScalar].push_back(FoldVectorTimesScalar());
  rules_[spv::Op::OpVectorTimesMatrix].push_back(FoldVectorTimesMatrix());
  rules_[spv::Op::OpMatrixTimesVector].push_back(FoldMatrixTimesVector());
  rules_[spv::Op::OpTranspose].push_back(FoldTranspose);

  rules_[spv::Op::OpFNegate].push_back(FoldFNegate());
  rules_[spv::Op::OpSNegate].push_back(FoldSNegate());
  rules_[spv::Op::OpQuantizeToF16].push_back(FoldQuantizeToF16());

  rules_[spv::Op::OpIAdd].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return a + b; })));
  rules_[spv::Op::OpISub].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return a - b; })));
  rules_[spv::Op::OpIMul].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return a * b; })));
  rules_[spv::Op::OpUDiv].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return (b != 0 ? a / b : 0); })));
  rules_[spv::Op::OpSDiv].push_back(FoldBinaryOp(
      FoldBinaryIntegerOperation<Signed>([](uint64_t a, uint64_t b) {
        return (b != 0 ? static_cast<uint64_t>(static_cast<int64_t>(a) /
                                               static_cast<int64_t>(b))
                       : 0);
      })));
  rules_[spv::Op::OpUMod].push_back(
      FoldBinaryOp(FoldBinaryIntegerOperation<Unsigned>(
          [](uint64_t a, uint64_t b) { return (b != 0 ? a % b : 0); })));

  rules_[spv::Op::OpSRem].push_back(FoldBinaryOp(
      FoldBinaryIntegerOperation<Signed>([](uint64_t a, uint64_t b) {
        return (b != 0 ? static_cast<uint64_t>(static_cast<int64_t>(a) %
                                               static_cast<int64_t>(b))
                       : 0);
      })));

  rules_[spv::Op::OpSMod].push_back(FoldBinaryOp(
      FoldBinaryIntegerOperation<Signed>([](uint64_t a, uint64_t b) {
        if (b == 0) return static_cast<uint64_t>(0ull);

        int64_t signed_a = static_cast<int64_t>(a);
        int64_t signed_b = static_cast<int64_t>(b);
        int64_t result = signed_a % signed_b;
        if ((signed_b < 0) != (result < 0)) result += signed_b;
        return static_cast<uint64_t>(result);
      })));

  // Add rules for GLSLstd450
  FeatureManager* feature_manager = context_->get_feature_mgr();
  uint32_t ext_inst_glslstd450_id =
      feature_manager->GetExtInstImportId_GLSLstd450();
  if (ext_inst_glslstd450_id != 0) {
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMix}].push_back(FoldFMix());
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SMin}].push_back(
        FoldFPBinaryOp(FoldMin));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UMin}].push_back(
        FoldFPBinaryOp(FoldMin));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMin}].push_back(
        FoldFPBinaryOp(FoldMin));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SMax}].push_back(
        FoldFPBinaryOp(FoldMax));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UMax}].push_back(
        FoldFPBinaryOp(FoldMax));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FMax}].push_back(
        FoldFPBinaryOp(FoldMax));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UClamp}].push_back(
        FoldClamp1);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UClamp}].push_back(
        FoldClamp2);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450UClamp}].push_back(
        FoldClamp3);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SClamp}].push_back(
        FoldClamp1);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SClamp}].push_back(
        FoldClamp2);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450SClamp}].push_back(
        FoldClamp3);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FClamp}].push_back(
        FoldClamp1);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FClamp}].push_back(
        FoldClamp2);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450FClamp}].push_back(
        FoldClamp3);
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Sin}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::sin)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Cos}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::cos)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Tan}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::tan)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Asin}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::asin)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Acos}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::acos)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Atan}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::atan)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Exp}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::exp)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Log}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::log)));

#ifdef __ANDROID__
    // Android NDK r15c targeting ABI 15 doesn't have full support for C++11
    // (no std::exp2/log2). ::exp2 is available from C99 but ::log2 isn't
    // available up until ABI 18 so we use a shim
    auto log2_shim = [](double v) -> double { return log(v) / log(2.0); };
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Exp2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(::exp2)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Log2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(log2_shim)));
#else
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Exp2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::exp2)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Log2}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::log2)));
#endif

    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Sqrt}].push_back(
        FoldFPUnaryOp(FoldFTranscendentalUnary(std::sqrt)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Atan2}].push_back(
        FoldFPBinaryOp(FoldFTranscendentalBinary(std::atan2)));
    ext_rules_[{ext_inst_glslstd450_id, GLSLstd450Pow}].push_back(
        FoldFPBinaryOp(FoldFTranscendentalBinary(std::pow)));
  }
}